

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::deSerializeFloat
          (btQuantizedBvh *this,btQuantizedBvhFloatData *quantizedBvhFloatData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  uint uVar4;
  btQuantizedBvhNode *ptr;
  btQuantizedBvhNodeData *pbVar5;
  btBvhSubtreeInfo *pbVar6;
  btBvhSubtreeInfoData *pbVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int i;
  uint uVar16;
  long lVar17;
  btOptimizedBvhNode *pbVar18;
  btOptimizedBvhNodeFloatData *pbVar19;
  btQuantizedBvhNode *pbVar20;
  btBvhSubtreeInfo *pbVar21;
  long lVar22;
  int *piVar23;
  int i_3;
  ulong uVar24;
  btOptimizedBvhNode *pbVar25;
  int i_4;
  
  lVar17 = 0;
  do {
    (this->m_bvhAabbMax).m_floats[lVar17] = (quantizedBvhFloatData->m_bvhAabbMax).m_floats[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  lVar17 = 0;
  do {
    (this->m_bvhAabbMin).m_floats[lVar17] = (quantizedBvhFloatData->m_bvhAabbMin).m_floats[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  lVar17 = 0;
  do {
    (this->m_bvhQuantization).m_floats[lVar17] =
         (quantizedBvhFloatData->m_bvhQuantization).m_floats[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  this->m_curNodeIndex = quantizedBvhFloatData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhFloatData->m_useQuantization != 0;
  uVar4 = quantizedBvhFloatData->m_numContiguousLeafNodes;
  uVar16 = (this->m_contiguousNodes).m_size;
  if ((int)uVar16 < (int)uVar4) {
    lVar17 = (long)(int)uVar16;
    if ((this->m_contiguousNodes).m_capacity < (int)uVar4) {
      if (uVar4 == 0) {
        pbVar18 = (btOptimizedBvhNode *)0x0;
      }
      else {
        pbVar18 = (btOptimizedBvhNode *)btAlignedAllocInternal((long)(int)uVar4 << 6,0x10);
        uVar16 = (this->m_contiguousNodes).m_size;
      }
      if (0 < (int)uVar16) {
        lVar22 = 0;
        do {
          pbVar25 = (this->m_contiguousNodes).m_data;
          puVar1 = (undefined8 *)((long)(pbVar25->m_aabbMinOrg).m_floats + lVar22);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pbVar25->m_aabbMaxOrg).m_floats + lVar22);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          uVar12 = *(undefined8 *)(pbVar25->m_padding + lVar22 + -0xc);
          uVar13 = *(undefined8 *)(pbVar25->m_padding + lVar22 + -0xc + 8);
          uVar14 = *(undefined8 *)(pbVar25->m_padding + lVar22 + 4 + 8);
          *(undefined8 *)(pbVar18->m_padding + lVar22 + 4) =
               *(undefined8 *)(pbVar25->m_padding + lVar22 + 4);
          *(undefined8 *)(pbVar18->m_padding + lVar22 + 4 + 8) = uVar14;
          *(undefined8 *)(pbVar18->m_padding + lVar22 + -0xc) = uVar12;
          *(undefined8 *)(pbVar18->m_padding + lVar22 + -0xc + 8) = uVar13;
          puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMaxOrg).m_floats + lVar22);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMinOrg).m_floats + lVar22);
          *puVar1 = uVar8;
          puVar1[1] = uVar9;
          lVar22 = lVar22 + 0x40;
        } while ((ulong)uVar16 << 6 != lVar22);
      }
      pbVar25 = (this->m_contiguousNodes).m_data;
      if ((pbVar25 != (btOptimizedBvhNode *)0x0) && ((this->m_contiguousNodes).m_ownsMemory == true)
         ) {
        btAlignedFreeInternal(pbVar25);
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pbVar18;
      (this->m_contiguousNodes).m_capacity = uVar4;
    }
    lVar22 = (int)uVar4 - lVar17;
    lVar17 = lVar17 << 6;
    do {
      pbVar18 = (this->m_contiguousNodes).m_data;
      pcVar3 = pbVar18->m_padding + lVar17 + 4;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3 = pbVar18->m_padding + lVar17 + -0xc;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMaxOrg).m_floats + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMinOrg).m_floats + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar17 = lVar17 + 0x40;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  (this->m_contiguousNodes).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar19 = quantizedBvhFloatData->m_contiguousNodesPtr;
    pbVar18 = (this->m_contiguousNodes).m_data;
    uVar24 = 0;
    pbVar25 = pbVar18;
    do {
      lVar17 = 4;
      do {
        (pbVar25->m_aabbMinOrg).m_floats[lVar17] = (pbVar19->m_aabbMinOrg).m_floats[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      lVar17 = 0;
      do {
        (pbVar25->m_aabbMinOrg).m_floats[lVar17] = (pbVar19->m_aabbMinOrg).m_floats[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      iVar15 = pbVar19->m_subPart;
      pbVar18[uVar24].m_escapeIndex = pbVar19->m_escapeIndex;
      pbVar18[uVar24].m_subPart = iVar15;
      pbVar18[uVar24].m_triangleIndex = pbVar19->m_triangleIndex;
      uVar24 = uVar24 + 1;
      pbVar19 = pbVar19 + 1;
      pbVar25 = pbVar25 + 1;
    } while (uVar24 != uVar4);
  }
  uVar4 = quantizedBvhFloatData->m_numQuantizedContiguousNodes;
  uVar16 = (this->m_quantizedContiguousNodes).m_size;
  if ((int)uVar16 < (int)uVar4) {
    lVar17 = (long)(int)uVar16;
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar4) {
      if (uVar4 == 0) {
        pbVar20 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar20 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)(int)uVar4 << 4,0x10);
        uVar16 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar16) {
        lVar22 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar22);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar20->m_quantizedAabbMin + lVar22);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar22 = lVar22 + 0x10;
        } while ((ulong)uVar16 << 4 != lVar22);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr != (btQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar20;
      (this->m_quantizedContiguousNodes).m_capacity = uVar4;
    }
    lVar22 = (int)uVar4 - lVar17;
    lVar17 = lVar17 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar17 = lVar17 + 0x10;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar5 = quantizedBvhFloatData->m_quantizedContiguousNodesPtr;
    pbVar20 = (this->m_quantizedContiguousNodes).m_data;
    lVar17 = 0;
    do {
      *(undefined4 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 6) =
           *(undefined4 *)((long)pbVar5->m_quantizedAabbMax + lVar17 + 6);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + lVar17);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 2) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + lVar17 + 2);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 4) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + lVar17 + 4);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + lVar17);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17 + 2) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + lVar17 + 2);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17 + 4) =
           *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + lVar17 + 4);
      lVar17 = lVar17 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar17);
  }
  this->m_traversalMode = quantizedBvhFloatData->m_traversalMode;
  uVar4 = quantizedBvhFloatData->m_numSubtreeHeaders;
  uVar16 = (this->m_SubtreeHeaders).m_size;
  if (((int)uVar16 < (int)uVar4) && ((this->m_SubtreeHeaders).m_capacity < (int)uVar4)) {
    if (uVar4 == 0) {
      pbVar21 = (btBvhSubtreeInfo *)0x0;
    }
    else {
      pbVar21 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)(int)uVar4 << 5,0x10);
      uVar16 = (this->m_SubtreeHeaders).m_size;
    }
    if (0 < (int)uVar16) {
      lVar17 = 0;
      do {
        pbVar6 = (this->m_SubtreeHeaders).m_data;
        puVar1 = (undefined8 *)((long)pbVar6->m_quantizedAabbMin + lVar17);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)pbVar6->m_padding + lVar17 + -4);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar21->m_padding + lVar17 + -4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)pbVar21->m_quantizedAabbMin + lVar17);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar17 = lVar17 + 0x20;
      } while ((ulong)uVar16 << 5 != lVar17);
    }
    pbVar6 = (this->m_SubtreeHeaders).m_data;
    if ((pbVar6 != (btBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar6);
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pbVar21;
    (this->m_SubtreeHeaders).m_capacity = uVar4;
  }
  (this->m_SubtreeHeaders).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar7 = quantizedBvhFloatData->m_subTreeInfoPtr;
    piVar23 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    lVar17 = 0;
    do {
      *(unsigned_short *)((long)piVar23 + -6) =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMax + lVar17);
      *(unsigned_short *)(piVar23 + -1) =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMax + lVar17 + 2);
      *(unsigned_short *)((long)piVar23 + -2) =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMax + lVar17 + 4);
      ((btBvhSubtreeInfo *)(piVar23 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMin + lVar17);
      *(unsigned_short *)((long)piVar23 + -10) =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMin + lVar17 + 2);
      *(unsigned_short *)(piVar23 + -2) =
           *(unsigned_short *)((long)pbVar7->m_quantizedAabbMin + lVar17 + 4);
      *(undefined8 *)piVar23 = *(undefined8 *)((long)pbVar7->m_quantizedAabbMin + lVar17 + -8);
      piVar23 = piVar23 + 8;
      lVar17 = lVar17 + 0x14;
    } while ((ulong)uVar4 * 0x14 != lVar17);
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeFloat(struct btQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhFloatData.m_traversalMode);
	
	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}